

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void vkt::BindingModel::anon_unknown_1::verifyDriverSupport
               (VkPhysicalDeviceFeatures *deviceFeatures,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *deviceExtensions,DescriptorUpdateMethod updateMethod,VkDescriptorType descType,
               VkShaderStageFlags activeStages)

{
  deBool dVar1;
  NotSupportedError *pNVar2;
  ulong uVar3;
  long lVar4;
  size_t deviceExtNdx;
  ulong uVar5;
  long lVar6;
  allocator<char> local_a9;
  DescriptorUpdateMethod local_a8;
  VkDescriptorType descType_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  VkShaderStageFlags local_60;
  VkDescriptorType local_5c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionNames;
  
  extensionNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  extensionNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  extensionNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  descType_local = descType;
  local_60 = activeStages;
  local_5c = descType;
  if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE) {
LAB_0053dbc5:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"VK_KHR_descriptor_update_template",(allocator<char> *)&local_80)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extensionNames,
               &local_a0);
  }
  else {
    if (updateMethod == DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"VK_KHR_push_descriptor",(allocator<char> *)&local_80);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &extensionNames,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      goto LAB_0053dbc5;
    }
    if (updateMethod != DESCRIPTOR_UPDATE_METHOD_WITH_PUSH) goto LAB_0053dbf4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"VK_KHR_push_descriptor",(allocator<char> *)&local_80);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extensionNames,
               &local_a0);
  }
  std::__cxx11::string::~string((string *)&local_a0);
LAB_0053dbf4:
  local_a8 = updateMethod;
  if ((long)extensionNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)extensionNames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar4 = (long)extensionNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)extensionNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    uVar5 = 0;
    do {
      if ((ulong)((long)(deviceExtensions->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(deviceExtensions->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar5) {
        pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        switch(local_a8) {
        case DESCRIPTOR_UPDATE_METHOD_NORMAL:
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_a9);
          break;
        case DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"with_template",&local_a9);
          break;
        case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"with_push",&local_a9);
          break;
        case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,"with_push_template",&local_a9);
          break;
        default:
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"N/A",&local_a9);
        }
        std::operator+(&local_a0,&local_80," tests are not supported");
        tcu::NotSupportedError::NotSupportedError
                  (pNVar2,local_a0._M_dataplus._M_p,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                   ,0xd7);
        __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      uVar3 = 0xffffffffffffffff;
      lVar6 = 0;
      do {
        uVar3 = uVar3 + 1;
        if ((ulong)((long)extensionNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)extensionNames.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3)
        goto LAB_0053dc63;
        dVar1 = deStringEqual((deviceExtensions->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p,
                              *(char **)((long)&((extensionNames.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar6));
        lVar6 = lVar6 + 0x20;
      } while (dVar1 == 0);
      lVar4 = lVar4 + -1;
LAB_0053dc63:
      uVar5 = uVar5 + 1;
    } while (lVar4 != 0);
  }
  if ((local_5c < VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT) && ((0x2a8U >> (local_5c & 0x1f) & 1) != 0))
  {
    if (((local_60 & 0xf) != 0) && (deviceFeatures->vertexPipelineStoresAndAtomics == 0)) {
      pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<vk::VkDescriptorType>(&local_80,&descType_local);
      std::operator+(&local_a0,&local_80," is not supported in the vertex pipeline");
      tcu::NotSupportedError::NotSupportedError
                (pNVar2,local_a0._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                 ,0xf0);
      __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if (((local_60 & 0x10) != 0) && (deviceFeatures->fragmentStoresAndAtomics == 0)) {
      pNVar2 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<vk::VkDescriptorType>(&local_80,&descType_local);
      std::operator+(&local_a0,&local_80," is not supported in fragment shaders");
      tcu::NotSupportedError::NotSupportedError
                (pNVar2,local_a0._M_dataplus._M_p,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/binding_model/vktBindingShaderAccessTests.cpp"
                 ,0xf6);
      __cxa_throw(pNVar2,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&extensionNames);
  return;
}

Assistant:

void verifyDriverSupport(const vk::VkPhysicalDeviceFeatures&	deviceFeatures,
						 const std::vector<std::string>&		deviceExtensions,
						 DescriptorUpdateMethod					updateMethod,
						 vk::VkDescriptorType					descType,
						 vk::VkShaderStageFlags					activeStages)
{
	std::vector<std::string>	extensionNames;
	size_t						numExtensionsNeeded = 0;

	switch (updateMethod)
	{
		case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH:
			extensionNames.push_back("VK_KHR_push_descriptor");
			break;

		// fall through
		case DESCRIPTOR_UPDATE_METHOD_WITH_PUSH_TEMPLATE:
			extensionNames.push_back("VK_KHR_push_descriptor");
		case DESCRIPTOR_UPDATE_METHOD_WITH_TEMPLATE:
			extensionNames.push_back("VK_KHR_descriptor_update_template");
			break;

		case DESCRIPTOR_UPDATE_METHOD_NORMAL:
			// no extensions needed
			break;

		default:
			DE_FATAL("Impossible");
	}

	numExtensionsNeeded = extensionNames.size();

	if (numExtensionsNeeded > 0)
	{
		for (size_t deviceExtNdx = 0; deviceExtNdx < deviceExtensions.size(); deviceExtNdx++)
		{
			for (size_t requiredExtNdx = 0; requiredExtNdx < extensionNames.size(); requiredExtNdx++)
			{
				if (deStringEqual(deviceExtensions[deviceExtNdx].c_str(), extensionNames[requiredExtNdx].c_str()))
				{
					--numExtensionsNeeded;
					break;
				}
			}

			if (numExtensionsNeeded == 0)
				break;
		}

		if (numExtensionsNeeded > 0)
		{
			TCU_THROW(NotSupportedError, (stringifyDescriptorUpdateMethod(updateMethod) + " tests are not supported").c_str());
		}
	}

	switch (descType)
	{
		case vk::VK_DESCRIPTOR_TYPE_SAMPLER:
		case vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER:
		case vk::VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
		case vk::VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
		case vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
		case vk::VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC:
			// These are supported in all stages
			return;

		case vk::VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
		case vk::VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
		case vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
		case vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER_DYNAMIC:
			if (activeStages & (vk::VK_SHADER_STAGE_VERTEX_BIT |
								vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT |
								vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT |
								vk::VK_SHADER_STAGE_GEOMETRY_BIT))
			{
				if (!deviceFeatures.vertexPipelineStoresAndAtomics)
					TCU_THROW(NotSupportedError, (de::toString(descType) + " is not supported in the vertex pipeline").c_str());
			}

			if (activeStages & vk::VK_SHADER_STAGE_FRAGMENT_BIT)
			{
				if (!deviceFeatures.fragmentStoresAndAtomics)
					TCU_THROW(NotSupportedError, (de::toString(descType) + " is not supported in fragment shaders").c_str());
			}
			return;

		default:
			DE_FATAL("Impossible");
	}
}